

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OdiPublisher.cpp
# Opt level: O2

bool OdiPublisher::CopyFile(char *source_file_name,char *dest_file_name)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  FILE *__stream_00;
  uint *puVar3;
  size_t sVar4;
  char *__format;
  bool bVar5;
  char line [512];
  
  __stream = (FILE *)ithi_file_open(source_file_name,"r");
  if (__stream == (FILE *)0x0) {
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    __format = "Could not read file %s, err: %d\n";
    dest_file_name = source_file_name;
  }
  else {
    __stream_00 = (FILE *)ithi_file_open(dest_file_name,"w");
    if (__stream_00 != (FILE *)0x0) {
      bVar5 = true;
      goto LAB_001a940e;
    }
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    __format = "Could not write file %s, err: %d\n";
  }
  __stream_00 = (FILE *)0x0;
  printf(__format,dest_file_name,(ulong)uVar1);
  bVar5 = false;
LAB_001a940e:
  do {
    if (!bVar5) {
      bVar5 = false;
LAB_001a9455:
      if (__stream != (FILE *)0x0) {
        fclose(__stream);
      }
      if (__stream_00 != (FILE *)0x0) {
        fclose(__stream_00);
      }
      return bVar5;
    }
    sVar4 = fread(line,1,0x200,__stream);
    if (sVar4 == 0) {
      iVar2 = feof(__stream);
      bVar5 = iVar2 != 0;
      goto LAB_001a9455;
    }
    sVar4 = fwrite(line,1,sVar4,__stream_00);
    bVar5 = sVar4 != 0;
  } while( true );
}

Assistant:

bool OdiPublisher::CopyFile(const char * source_file_name, const char * dest_file_name)
{
    bool ret = true;
    char line[512];
    FILE * F_out = NULL;
    FILE* F_in = ithi_file_open(source_file_name, "r");

    if (F_in != NULL)
    {
        F_out = ithi_file_open(dest_file_name, "w");
        if (F_out == NULL) {
            printf("Could not write file %s, err: %d\n", dest_file_name, errno);
            ret = false;
        }
    }
    else {
        printf("Could not read file %s, err: %d\n", source_file_name, errno);
        ret = false;
    }

    while (ret) {
        size_t nb_read = fread(line, 1, sizeof(line), F_in);

        if (nb_read > 0) {
            ret = fwrite(line, 1, nb_read, F_out) > 0;
        }
        else {
            ret = feof(F_in) != 0;
            break;
        }
    }

    if (F_in != NULL) {
        fclose(F_in);
    }

    if (F_out != NULL) {
        fclose(F_out);
    }

    return ret;
}